

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

QList<QList<QGraphicsItem_*>_> * __thiscall
QList<QList<QGraphicsItem_*>_>::fill
          (QList<QList<QGraphicsItem_*>_> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  Data *pDVar2;
  QArrayData *pQVar3;
  QGraphicsItem **ppQVar4;
  qsizetype qVar5;
  QList<QGraphicsItem_*> *data;
  QList<QGraphicsItem_*> *pQVar6;
  long lVar7;
  QArrayDataPointer<QGraphicsItem_*> *this_00;
  long lVar8;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QList<QGraphicsItem_*>_> local_58;
  QArrayData *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  lVar7 = newSize;
  if (pDVar1 != (Data *)0x0) {
    lVar7 = (pDVar1->super_QArrayData).alloc;
    if (newSize <= lVar7 &&
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      pQVar3 = &((t->d).d)->super_QArrayData;
      ppQVar4 = (t->d).ptr;
      qVar5 = (t->d).size;
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      lVar7 = (this->d).size;
      lVar8 = newSize;
      if (lVar7 < newSize) {
        lVar8 = lVar7;
      }
      if (lVar8 != 0) {
        lVar8 = lVar8 * 0x18;
        this_00 = &((this->d).ptr)->d;
        do {
          QArrayDataPointer<QGraphicsItem_*>::operator=(this_00,&t->d);
          lVar8 = lVar8 + -0x18;
          this_00 = this_00 + 1;
        } while (lVar8 != 0);
        lVar7 = (this->d).size;
      }
      if (lVar7 < newSize) {
        if (newSize != lVar7) {
          pQVar6 = (this->d).ptr;
          lVar8 = lVar7 - newSize;
          do {
            pQVar6[lVar7].d.d = (Data *)pQVar3;
            pQVar6[lVar7].d.ptr = ppQVar4;
            pQVar6[lVar7].d.size = qVar5;
            if (pQVar3 != (QArrayData *)0x0) {
              LOCK();
              (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
              lVar7 = (this->d).size;
            }
            lVar7 = lVar7 + 1;
            (this->d).size = lVar7;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0);
        }
      }
      else if (newSize < lVar7) {
        pQVar6 = (this->d).ptr;
        std::_Destroy_aux<false>::__destroy<QList<QGraphicsItem*>*>(pQVar6 + newSize,pQVar6 + lVar7)
        ;
        (this->d).size = newSize;
      }
      if (pQVar3 != (QArrayData *)0x0) {
        LOCK();
        (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar3,8,0x10);
        }
      }
      goto LAB_00621b1f;
    }
    if (lVar7 <= newSize) {
      lVar7 = newSize;
    }
    if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
         super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) == 0) {
      lVar7 = newSize;
    }
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QList<QGraphicsItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = (QList<QGraphicsItem_*> *)QArrayData::allocate(&local_40,0x18,0x10,lVar7,KeepSize);
  lVar7 = 0;
  for (; newSize != 0; newSize = newSize + -1) {
    pDVar2 = (t->d).d;
    pQVar6[lVar7].d.d = pDVar2;
    pQVar6[lVar7].d.ptr = (t->d).ptr;
    pQVar6[lVar7].d.size = (t->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar7 = lVar7 + 1;
  }
  local_58.d = (this->d).d;
  (this->d).d = (Data *)local_40;
  local_58.ptr = (this->d).ptr;
  (this->d).ptr = pQVar6;
  local_58.size = (this->d).size;
  (this->d).size = lVar7;
  QArrayDataPointer<QList<QGraphicsItem_*>_>::~QArrayDataPointer(&local_58);
LAB_00621b1f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}